

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_flow_scalar(yaml_parser_t *parser,int single)

{
  size_t *psVar1;
  yaml_token_t **tail;
  yaml_char_t yVar2;
  yaml_char_t *pyVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 *puVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  ulong uVar11;
  byte *pbVar12;
  size_t sVar13;
  char *pcVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  byte bVar18;
  long lVar19;
  long lVar20;
  byte *pbVar21;
  yaml_token_t *pyVar22;
  undefined1 __s [8];
  yaml_token_t *pyVar23;
  yaml_char_t **ppyVar24;
  bool bVar25;
  byte bVar26;
  ulong uStack_130;
  undefined1 (*local_128) [16];
  undefined1 (*pauStack_120) [16];
  undefined1 (*apauStack_118 [2]) [16];
  undefined1 local_108 [8];
  undefined1 (*pauStack_100) [16];
  yaml_char_t *local_f8 [2];
  undefined1 local_e8 [8];
  undefined1 (*pauStack_e0) [16];
  undefined1 (*local_d8 [2]) [16];
  undefined1 local_c8 [8];
  undefined1 (*pauStack_c0) [16];
  undefined1 (*local_b8) [16];
  yaml_mark_t *local_b0;
  yaml_mark_t start_mark;
  yaml_token_t local_88;
  
  bVar26 = 0;
  iVar8 = yaml_parser_save_simple_key(parser);
  if (iVar8 != 0) {
    parser->simple_key_allowed = 0;
    pauStack_120 = (undefined1 (*) [16])0x0;
    apauStack_118[0] = (undefined1 (*) [16])0x0;
    _local_e8 = (undefined1  [16])0x0;
    local_d8[0] = (undefined1 (*) [16])0x0;
    _local_108 = (undefined1  [16])0x0;
    local_f8[0] = (yaml_char_t *)0x0;
    _local_c8 = (undefined1  [16])0x0;
    local_b8 = (undefined1 (*) [16])0x0;
    local_128 = (undefined1 (*) [16])yaml_malloc(0x10);
    if (local_128 != (undefined1 (*) [16])0x0) {
      pauStack_120 = local_128 + 1;
      *local_128 = (undefined1  [16])0x0;
      apauStack_118[0] = local_128;
      pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
      local_e8 = (undefined1  [8])pauVar10;
      if (pauVar10 != (undefined1 (*) [16])0x0) {
        pauStack_e0 = pauVar10 + 1;
        *pauVar10 = (undefined1  [16])0x0;
        local_d8[0] = pauVar10;
        pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
        local_108 = (undefined1  [8])pauVar10;
        if (pauVar10 != (undefined1 (*) [16])0x0) {
          pauStack_100 = pauVar10 + 1;
          *pauVar10 = (undefined1  [16])0x0;
          local_f8[0] = (yaml_char_t *)pauVar10;
          pauVar10 = (undefined1 (*) [16])yaml_malloc(0x10);
          local_c8 = (undefined1  [8])pauVar10;
          if (pauVar10 != (undefined1 (*) [16])0x0) {
            local_b8 = pauVar10;
            pauStack_c0 = pauVar10 + 1;
            *pauVar10 = (undefined1  [16])0x0;
            start_mark.column = (parser->mark).column;
            start_mark.line = (parser->mark).line;
            start_mark.index = (parser->mark).index;
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            pbVar21 = (parser->buffer).pointer;
            uVar11 = parser->unread - 1;
            parser->unread = uVar11;
            bVar15 = *pbVar21;
            lVar17 = 1;
            lVar19 = lVar17;
            if ((((char)bVar15 < '\0') && (lVar19 = 2, (bVar15 & 0xe0) != 0xc0)) &&
               (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)) {
              lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
            }
            local_b0 = &parser->mark;
            (parser->buffer).pointer = pbVar21 + lVar19;
LAB_0010c67e:
            if ((3 < uVar11) || (iVar8 = yaml_parser_update_buffer(parser,4), iVar8 != 0)) {
              pyVar3 = (parser->buffer).pointer;
              yVar2 = *pyVar3;
              if ((parser->mark).column == 0) {
                if (yVar2 == '-') {
                  if ((pyVar3[1] != '-') || (pyVar3[2] != '-')) goto LAB_0010c6b3;
                }
                else {
                  if (yVar2 != '.') goto LAB_0010c6ab;
                  if ((pyVar3[1] != '.') || (pyVar3[2] != '.')) goto LAB_0010c6b3;
                }
                bVar15 = pyVar3[3];
                if (bVar15 == 0xc2) {
                  if (pyVar3[4] != 0x85) goto LAB_0010c6b3;
                }
                else if (((bVar15 == 0xe2) || (0x20 < bVar15)) ||
                        ((0x100002601U >> ((ulong)bVar15 & 0x3f) & 1) == 0)) {
LAB_0010c6b3:
                  uVar11 = parser->unread;
joined_r0x0010c6bb:
                  if ((uVar11 < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
                  goto LAB_0010d806;
                  pbVar21 = (parser->buffer).pointer;
                  bVar15 = *pbVar21;
                  if (bVar15 == 0xc2) {
                    if (pbVar21[1] == 0x85) goto LAB_0010cf99;
                  }
                  else if (((bVar15 != 0xe2) && (bVar15 < 0x21)) &&
                          ((0x100002601U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) goto LAB_0010cf99;
                  bVar18 = 0x22;
                  if (((single != 0) && (bVar18 = 0x27, bVar15 == 0x27)) && (pbVar21[1] == 0x27)) {
                    if (((undefined1 (*) [16])(*apauStack_118[0] + 5) < pauStack_120) ||
                       (iVar8 = yaml_string_extend((yaml_char_t **)&local_128,
                                                   (yaml_char_t **)apauStack_118,
                                                   (yaml_char_t **)&pauStack_120), iVar8 != 0))
                    goto LAB_0010c7df;
                    goto LAB_0010d800;
                  }
                  if (bVar18 == bVar15) goto LAB_0010cf99;
                  if (bVar15 == 0x5c && single == 0) {
                    bVar15 = pbVar21[1];
                    if (bVar15 == 0xc2) {
                      if (pbVar21[2] == 0x85) {
LAB_0010cfe5:
                        uVar11 = parser->unread;
                        pbVar12 = pbVar21;
                        if (uVar11 < 3) {
                          iVar8 = yaml_parser_update_buffer(parser,3);
                          if (iVar8 == 0) goto LAB_0010d806;
                          pbVar12 = (parser->buffer).pointer;
                          uVar11 = parser->unread;
                        }
                        sVar4 = (parser->mark).index;
                        (parser->mark).index = sVar4 + 1;
                        psVar1 = &(parser->mark).column;
                        *psVar1 = *psVar1 + 1;
                        sVar13 = uVar11 - 1;
                        parser->unread = sVar13;
                        bVar15 = *pbVar12;
                        lVar19 = lVar17;
                        if ((((char)bVar15 < '\0') && (lVar19 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                           (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)) {
                          lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                        }
                        pbVar21 = pbVar12 + lVar19;
                        (parser->buffer).pointer = pbVar21;
                        bVar15 = pbVar12[lVar19];
                        if (bVar15 == 10) {
LAB_0010d0f7:
                          (parser->mark).index = sVar4 + 2;
                          (parser->mark).column = 0;
                          psVar1 = &(parser->mark).line;
                          *psVar1 = *psVar1 + 1;
                          sVar13 = uVar11 - 2;
                          parser->unread = sVar13;
                          bVar15 = *pbVar21;
                          lVar19 = lVar17;
                          if ((((char)bVar15 < '\0') && (lVar19 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                             (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)) {
                            lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                          }
                          pbVar21 = pbVar21 + lVar19;
LAB_0010d15a:
                          (parser->buffer).pointer = pbVar21;
                        }
                        else if (bVar15 != 0xe2) {
                          if (bVar15 == 0xc2) {
                            if (pbVar21[1] == 0x85) goto LAB_0010d0f7;
                          }
                          else if (bVar15 == 0xd) {
                            if (pbVar21[1] != 10) goto LAB_0010d0f7;
                            (parser->mark).index = sVar4 + 3;
                            (parser->mark).column = 0;
                            psVar1 = &(parser->mark).line;
                            *psVar1 = *psVar1 + 1;
                            sVar13 = uVar11 - 3;
                            parser->unread = sVar13;
                            pbVar21 = pbVar21 + 2;
                            goto LAB_0010d15a;
                          }
                        }
                        bVar25 = true;
                        goto LAB_0010cfa3;
                      }
                    }
                    else if ((bVar15 != 0xe2) && ((bVar15 == 10 || (bVar15 == 0xd))))
                    goto LAB_0010cfe5;
                    if (pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) {
                      iVar8 = yaml_string_extend((yaml_char_t **)&local_128,
                                                 (yaml_char_t **)apauStack_118,
                                                 (yaml_char_t **)&pauStack_120);
                      if (iVar8 == 0) goto LAB_0010d800;
                      bVar15 = (parser->buffer).pointer[1];
                    }
                    switch(bVar15) {
                    case 0x5c:
                      (*apauStack_118[0])[0] = 0x5c;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x5d:
                    case 0x5e:
                    case 0x60:
                    case 99:
                    case 100:
                    case 0x67:
                    case 0x68:
                    case 0x69:
                    case 0x6a:
                    case 0x6b:
                    case 0x6c:
                    case 0x6d:
                    case 0x6f:
                    case 0x70:
                    case 0x71:
                    case 0x73:
                    case 0x77:
switchD_0010cab8_caseD_5d:
                      parser->error = YAML_SCANNER_ERROR;
                      parser->context = "while parsing a quoted scalar";
                      (parser->context_mark).index = start_mark.index;
                      (parser->context_mark).line = start_mark.line;
                      (parser->context_mark).column = start_mark.column;
                      pcVar14 = "found unknown escape character";
                      goto LAB_0010d906;
                    case 0x5f:
                      (*apauStack_118[0])[0] = 0xc2;
                      (*apauStack_118[0])[1] = 0xa0;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 2);
                      break;
                    case 0x61:
                      (*apauStack_118[0])[0] = 7;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x62:
                      (*apauStack_118[0])[0] = 8;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x65:
                      (*apauStack_118[0])[0] = 0x1b;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x66:
                      (*apauStack_118[0])[0] = 0xc;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x6e:
                      (*apauStack_118[0])[0] = 10;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x72:
                      (*apauStack_118[0])[0] = 0xd;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x74:
switchD_0010cab8_caseD_74:
                      (*apauStack_118[0])[0] = 9;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x75:
                      uStack_130 = 4;
                      goto LAB_0010cc6a;
                    case 0x76:
                      (*apauStack_118[0])[0] = 0xb;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      break;
                    case 0x78:
                      uStack_130 = 2;
LAB_0010cc6a:
                      bVar25 = false;
                      goto LAB_0010cce3;
                    default:
                      switch(bVar15) {
                      case 0x4c:
                        (*apauStack_118[0])[0] = 0xe2;
                        puVar6 = *apauStack_118[0];
                        (*apauStack_118[0])[1] = 0x80;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 3);
                        puVar6[2] = 0xa8;
                        break;
                      case 0x4d:
                      case 0x4f:
                      case 0x51:
                      case 0x52:
                      case 0x53:
                      case 0x54:
                        goto switchD_0010cab8_caseD_5d;
                      case 0x4e:
                        puVar6 = *apauStack_118[0];
                        (*apauStack_118[0])[0] = 0xc2;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 2);
                        puVar6[1] = 0x85;
                        break;
                      case 0x50:
                        (*apauStack_118[0])[0] = 0xe2;
                        puVar6 = *apauStack_118[0];
                        (*apauStack_118[0])[1] = 0x80;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 3);
                        puVar6[2] = 0xa9;
                        break;
                      case 0x55:
                        uStack_130 = 8;
                        goto LAB_0010cc6a;
                      default:
                        if (bVar15 == 9) goto switchD_0010cab8_caseD_74;
                        if (bVar15 == 0x20) {
                          (*apauStack_118[0])[0] = 0x20;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                        else if (bVar15 == 0x22) {
                          (*apauStack_118[0])[0] = 0x22;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                        else if (bVar15 == 0x2f) {
                          (*apauStack_118[0])[0] = 0x2f;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                        else {
                          if (bVar15 != 0x30) goto switchD_0010cab8_caseD_5d;
                          (*apauStack_118[0])[0] = 0;
                          apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        }
                      }
                    }
                    bVar25 = true;
                    uStack_130 = 0;
LAB_0010cce3:
                    sVar13 = (parser->mark).index;
                    (parser->mark).index = sVar13 + 1;
                    sVar4 = (parser->mark).column;
                    (parser->mark).column = sVar4 + 1;
                    pbVar21 = (parser->buffer).pointer;
                    sVar5 = parser->unread;
                    parser->unread = sVar5 - 1;
                    bVar15 = *pbVar21;
                    lVar19 = lVar17;
                    if ((((char)bVar15 < '\0') && (lVar19 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                       (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)) {
                      lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                    }
                    (parser->buffer).pointer = pbVar21 + lVar19;
                    (parser->mark).index = sVar13 + 2;
                    (parser->mark).column = sVar4 + 2;
                    uVar11 = sVar5 - 2;
                    parser->unread = uVar11;
                    bVar15 = pbVar21[lVar19];
                    lVar20 = lVar17;
                    if ((((char)bVar15 < '\0') && (lVar20 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                       (lVar20 = 3, (bVar15 & 0xf0) != 0xe0)) {
                      lVar20 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                    }
                    (parser->buffer).pointer = pbVar21 + lVar19 + lVar20;
                    if (!bVar25) {
                      if ((uVar11 < uStack_130) &&
                         (iVar8 = yaml_parser_update_buffer(parser,uStack_130), iVar8 == 0))
                      goto LAB_0010d806;
                      uVar11 = 0;
                      for (uVar16 = 0; uVar9 = (uint)uVar11, uStack_130 != uVar16;
                          uVar16 = uVar16 + 1) {
                        bVar15 = (parser->buffer).pointer[uVar16];
                        if ((9 < (byte)(bVar15 - 0x30)) &&
                           ((0x25 < bVar15 - 0x41 ||
                            ((0x3f0000003fU >> ((ulong)(bVar15 - 0x41) & 0x3f) & 1) == 0)))) {
                          parser->error = YAML_SCANNER_ERROR;
                          parser->context = "while parsing a quoted scalar";
                          (parser->context_mark).index = start_mark.index;
                          (parser->context_mark).line = start_mark.line;
                          (parser->context_mark).column = start_mark.column;
                          pcVar14 = "did not find expected hexdecimal number";
                          goto LAB_0010d906;
                        }
                        iVar8 = -0x30;
                        if (0x60 < bVar15) {
                          iVar8 = -0x57;
                        }
                        if ((byte)(bVar15 + 0xbf) < 6) {
                          iVar8 = -0x37;
                        }
                        uVar11 = (ulong)(uVar9 * 0x10 + (uint)bVar15 + iVar8);
                      }
                      if ((0x10ffff < uVar9) || ((uVar9 & 0xfffff800) == 0xd800)) {
                        parser->error = YAML_SCANNER_ERROR;
                        parser->context = "while parsing a quoted scalar";
                        (parser->context_mark).index = start_mark.index;
                        (parser->context_mark).line = start_mark.line;
                        (parser->context_mark).column = start_mark.column;
                        pcVar14 = "found invalid Unicode character escape code";
                        goto LAB_0010d906;
                      }
                      if (0x7f < uVar9) {
                        if (uVar9 < 0x800) {
                          bVar15 = (byte)(uVar11 >> 6) | 0xc0;
                        }
                        else {
                          puVar6 = *apauStack_118[0];
                          if (uVar9 < 0x10000) {
                            (*apauStack_118[0])[0] = (byte)(uVar9 >> 0xc) | 0xe0;
                            apauStack_118[0] = (undefined1 (*) [16])(puVar6 + 1);
                          }
                          else {
                            (*apauStack_118[0])[0] = (byte)(uVar9 >> 0x12) | 0xf0;
                            apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 2);
                            (*(undefined1 (*) [16])(puVar6 + 1))[0] =
                                 (byte)(uVar11 >> 0xc) & 0x3f | 0x80;
                          }
                          bVar15 = (byte)(uVar11 >> 6) & 0x3f | 0x80;
                        }
                        (*apauStack_118[0])[0] = bVar15;
                        uVar11 = (ulong)((byte)uVar11 & 0x3f | 0x80);
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                      }
                      (*apauStack_118[0])[0] = (char)uVar11;
                      while (bVar25 = uStack_130 != 0, uStack_130 = uStack_130 - 1, bVar25) {
                        (parser->mark).index = (parser->mark).index + 1;
                        psVar1 = &(parser->mark).column;
                        *psVar1 = *psVar1 + 1;
                        parser->unread = parser->unread - 1;
                        pbVar21 = (parser->buffer).pointer;
                        bVar15 = *pbVar21;
                        lVar19 = lVar17;
                        if ((((char)bVar15 < '\0') && (lVar19 = 2, (bVar15 & 0xe0) != 0xc0)) &&
                           (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)) {
                          lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
                        }
                        (parser->buffer).pointer = pbVar21 + lVar19;
                      }
                      uVar11 = parser->unread;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                    }
                  }
                  else {
                    if (pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) {
                      iVar8 = yaml_string_extend((yaml_char_t **)&local_128,
                                                 (yaml_char_t **)apauStack_118,
                                                 (yaml_char_t **)&pauStack_120);
                      if (iVar8 == 0) goto LAB_0010d800;
                      pbVar21 = (parser->buffer).pointer;
                      bVar15 = *pbVar21;
                    }
                    if ((char)bVar15 < '\0') {
                      if ((bVar15 & 0xe0) == 0xc0) {
LAB_0010c9e5:
                        (parser->buffer).pointer = pbVar21 + 1;
                        (*apauStack_118[0])[0] = *pbVar21;
                        pbVar21 = (parser->buffer).pointer;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        goto LAB_0010ca09;
                      }
                      if ((bVar15 & 0xf0) == 0xe0) {
LAB_0010c9c1:
                        (parser->buffer).pointer = pbVar21 + 1;
                        (*apauStack_118[0])[0] = *pbVar21;
                        pbVar21 = (parser->buffer).pointer;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        goto LAB_0010c9e5;
                      }
                      if ((bVar15 & 0xf8) == 0xf0) {
                        (parser->buffer).pointer = pbVar21 + 1;
                        (*apauStack_118[0])[0] = *pbVar21;
                        pbVar21 = (parser->buffer).pointer;
                        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                        goto LAB_0010c9c1;
                      }
                    }
                    else {
LAB_0010ca09:
                      (parser->buffer).pointer = pbVar21 + 1;
                      (*apauStack_118[0])[0] = *pbVar21;
                      apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
                    }
                    (parser->mark).index = (parser->mark).index + 1;
                    psVar1 = &(parser->mark).column;
                    *psVar1 = *psVar1 + 1;
                    uVar11 = parser->unread - 1;
                    parser->unread = uVar11;
                  }
                  goto joined_r0x0010c6bb;
                }
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a quoted scalar";
                (parser->context_mark).index = start_mark.index;
                (parser->context_mark).line = start_mark.line;
                (parser->context_mark).column = start_mark.column;
                pcVar14 = "found unexpected document indicator";
              }
              else {
LAB_0010c6ab:
                if (yVar2 != '\0') goto LAB_0010c6b3;
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a quoted scalar";
                (parser->context_mark).index = start_mark.index;
                (parser->context_mark).line = start_mark.line;
                (parser->context_mark).column = start_mark.column;
                pcVar14 = "found unexpected end of stream";
              }
LAB_0010d906:
              parser->problem = pcVar14;
              sVar13 = local_b0->line;
              (parser->problem_mark).index = local_b0->index;
              (parser->problem_mark).line = sVar13;
              (parser->problem_mark).column = local_b0->column;
            }
            goto LAB_0010d806;
          }
        }
      }
    }
LAB_0010d800:
    parser->error = YAML_MEMORY_ERROR;
LAB_0010d806:
    yaml_free(local_128);
    local_128 = (undefined1 (*) [16])0x0;
    pauStack_120 = (undefined1 (*) [16])0x0;
    apauStack_118[0] = (undefined1 (*) [16])0x0;
    yaml_free((void *)local_e8);
    _local_e8 = (undefined1  [16])0x0;
    local_d8[0] = (undefined1 (*) [16])0x0;
    yaml_free((void *)local_108);
    _local_108 = (undefined1  [16])0x0;
    local_f8[0] = (yaml_char_t *)0x0;
    yaml_free((void *)local_c8);
  }
  return 0;
LAB_0010c7df:
  (*apauStack_118[0])[0] = 0x27;
  sVar13 = (parser->mark).index;
  (parser->mark).index = sVar13 + 1;
  sVar4 = (parser->mark).column;
  (parser->mark).column = sVar4 + 1;
  pbVar21 = (parser->buffer).pointer;
  sVar5 = parser->unread;
  parser->unread = sVar5 - 1;
  bVar15 = *pbVar21;
  lVar19 = lVar17;
  if (((char)bVar15 < '\0') &&
     ((lVar19 = 2, (bVar15 & 0xe0) != 0xc0 && (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)))) {
    lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar21 + lVar19;
  (parser->mark).index = sVar13 + 2;
  (parser->mark).column = sVar4 + 2;
  uVar11 = sVar5 - 2;
  parser->unread = uVar11;
  bVar15 = pbVar21[lVar19];
  lVar20 = lVar17;
  if ((((char)bVar15 < '\0') && (lVar20 = 2, (bVar15 & 0xe0) != 0xc0)) &&
     (lVar20 = 3, (bVar15 & 0xf0) != 0xe0)) {
    lVar20 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
  }
  (parser->buffer).pointer = pbVar21 + lVar19 + lVar20;
  apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
  goto joined_r0x0010c6bb;
LAB_0010cf99:
  sVar13 = parser->unread;
  bVar25 = false;
LAB_0010cfa3:
  if (sVar13 == 0) {
    iVar8 = yaml_parser_update_buffer(parser,1);
    if (iVar8 == 0) goto LAB_0010d806;
    pbVar21 = (parser->buffer).pointer;
  }
  if ((byte)((single != 0) * '\x05' + 0x22U) == *pbVar21) {
    (parser->mark).index = (parser->mark).index + 1;
    psVar1 = &(parser->mark).column;
    *psVar1 = *psVar1 + 1;
    parser->unread = parser->unread - 1;
    bVar15 = *pbVar21;
    if ((char)bVar15 < '\0') {
      if ((bVar15 & 0xe0) == 0xc0) {
        uStack_130 = 2;
      }
      else if ((bVar15 & 0xf0) == 0xe0) {
        uStack_130 = 3;
      }
      else {
        uStack_130 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
      }
    }
    else {
      uStack_130 = 1;
    }
    (parser->buffer).pointer = pbVar21 + uStack_130;
    local_88.end_mark.column = local_b0->column;
    local_88.end_mark.index = local_b0->index;
    local_88.end_mark.line = local_b0->line;
    local_88.type = YAML_SCALAR_TOKEN;
    local_88._4_4_ = 0;
    local_88.start_mark.index = start_mark.index;
    local_88.start_mark.line = start_mark.line;
    local_88.start_mark.column = start_mark.column;
    local_88.data.tag.handle = (yaml_char_t *)local_128;
    local_88.data.tag.suffix = (yaml_char_t *)((long)apauStack_118[0] - (long)local_128);
    local_88.data._20_4_ = 0;
    local_88.data.scalar.style = (single == 0) + 2;
    yaml_free((void *)local_e8);
    _local_e8 = (undefined1  [16])0x0;
    local_d8[0] = (undefined1 (*) [16])0x0;
    yaml_free((void *)local_108);
    _local_108 = (undefined1  [16])0x0;
    local_f8[0] = (yaml_char_t *)0x0;
    yaml_free((void *)local_c8);
    tail = &(parser->tokens).tail;
    pyVar23 = (parser->tokens).tail;
    if (pyVar23 == (parser->tokens).end) {
      iVar8 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                &(parser->tokens).end);
      if (iVar8 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_token_delete(&local_88);
        return 0;
      }
      pyVar23 = *tail;
    }
    *tail = pyVar23 + 1;
    pyVar22 = &local_88;
    for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
      uVar7 = *(undefined4 *)&pyVar22->field_0x4;
      pyVar23->type = pyVar22->type;
      *(undefined4 *)&pyVar23->field_0x4 = uVar7;
      pyVar22 = (yaml_token_t *)((long)pyVar22 + ((ulong)bVar26 * -2 + 1) * 8);
      pyVar23 = (yaml_token_t *)((long)pyVar23 + (ulong)bVar26 * -0x10 + 8);
    }
    return 1;
  }
  sVar13 = parser->unread;
  do {
    while( true ) {
      if ((sVar13 == 0) && (iVar8 = yaml_parser_update_buffer(parser,1), iVar8 == 0))
      goto LAB_0010d806;
      pbVar21 = (parser->buffer).pointer;
      bVar15 = *pbVar21;
      if (bVar15 != 9) break;
LAB_0010d1cd:
      if (bVar25) {
        (parser->mark).index = (parser->mark).index + 1;
        psVar1 = &(parser->mark).column;
        *psVar1 = *psVar1 + 1;
        parser->unread = parser->unread - 1;
        bVar15 = *pbVar21;
        lVar19 = lVar17;
        if ((((char)bVar15 < '\0') && (lVar19 = 2, (bVar15 & 0xe0) != 0xc0)) &&
           (lVar19 = 3, (bVar15 & 0xf0) != 0xe0)) {
          lVar19 = (ulong)((bVar15 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar21 + lVar19;
        goto LAB_0010d67b;
      }
      if (*local_b8 + 5 < pauStack_c0) {
LAB_0010d433:
        pauVar10 = local_b8;
        (parser->buffer).pointer = pbVar21 + 1;
        local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
        (*pauVar10)[0] = *pbVar21;
      }
      else {
        iVar8 = yaml_string_extend((yaml_char_t **)local_c8,(yaml_char_t **)&local_b8,
                                   (yaml_char_t **)(local_c8 + 8));
        if (iVar8 == 0) goto LAB_0010d800;
        pbVar21 = (parser->buffer).pointer;
        bVar15 = *pbVar21;
        if (-1 < (char)bVar15) goto LAB_0010d433;
        if ((bVar15 & 0xe0) == 0xc0) {
LAB_0010d40f:
          (parser->buffer).pointer = pbVar21 + 1;
          (*local_b8)[0] = *pbVar21;
          pbVar21 = (parser->buffer).pointer;
          local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
          goto LAB_0010d433;
        }
        if ((bVar15 & 0xf0) == 0xe0) {
LAB_0010d3eb:
          (parser->buffer).pointer = pbVar21 + 1;
          (*local_b8)[0] = *pbVar21;
          pbVar21 = (parser->buffer).pointer;
          local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
          goto LAB_0010d40f;
        }
        if ((bVar15 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar21 + 1;
          (*local_b8)[0] = *pbVar21;
          pbVar21 = (parser->buffer).pointer;
          local_b8 = (undefined1 (*) [16])(*local_b8 + 1);
          goto LAB_0010d3eb;
        }
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      sVar13 = parser->unread - 1;
      parser->unread = sVar13;
      bVar25 = false;
    }
    if ((bVar15 != 10) && (bVar15 != 0xd)) {
      if (bVar15 == 0x20) goto LAB_0010d1cd;
      if (((bVar15 == 0xe2) || (bVar15 != 0xc2)) || (pbVar21[1] != 0x85)) break;
    }
    if ((parser->unread < 2) && (iVar8 = yaml_parser_update_buffer(parser,2), iVar8 == 0))
    goto LAB_0010d806;
    if (bVar25) {
      if ((pauStack_100 <= local_f8[0] + 5) &&
         (iVar8 = yaml_string_extend((yaml_char_t **)local_108,local_f8,
                                     (yaml_char_t **)(local_108 + 8)), iVar8 == 0))
      goto LAB_0010d800;
      pauVar10 = (undefined1 (*) [16])local_f8[0];
      pyVar3 = (parser->buffer).pointer;
      yVar2 = *pyVar3;
      if (yVar2 == 0xe2) goto LAB_0010d67b;
      if (yVar2 != '\r') {
        if (yVar2 == 0xc2) {
          if (pyVar3[1] == 0x85) {
            local_f8[0] = (yaml_char_t *)(local_f8[0] + 1);
LAB_0010d5bc:
            (*pauVar10)[0] = 10;
            ppyVar24 = &(parser->buffer).pointer;
            *ppyVar24 = *ppyVar24 + 2;
            goto LAB_0010d648;
          }
        }
        else if (yVar2 == '\n') goto LAB_0010d490;
        goto LAB_0010d67b;
      }
      if (pyVar3[1] != '\n') {
LAB_0010d490:
        local_f8[0] = (yaml_char_t *)(local_f8[0] + 1);
        goto LAB_0010d595;
      }
      local_f8[0] = (yaml_char_t *)(local_f8[0] + 1);
LAB_0010d551:
      (*pauVar10)[0] = 10;
      ppyVar24 = &(parser->buffer).pointer;
      *ppyVar24 = *ppyVar24 + 2;
      (parser->mark).column = 0;
      (parser->mark).index = (parser->mark).index + 2;
      (parser->mark).line = (parser->mark).line + 1;
      sVar13 = parser->unread - 2;
LAB_0010d672:
      parser->unread = sVar13;
    }
    else {
      local_b8 = (undefined1 (*) [16])local_c8;
      memset((void *)local_c8,0,(long)pauStack_c0 - (long)local_c8);
      if ((pauStack_e0 <= *local_d8[0] + 5) &&
         (iVar8 = yaml_string_extend((yaml_char_t **)local_e8,(yaml_char_t **)local_d8,
                                     (yaml_char_t **)(local_e8 + 8)), iVar8 == 0))
      goto LAB_0010d800;
      pyVar3 = (parser->buffer).pointer;
      yVar2 = *pyVar3;
      if (yVar2 != 0xe2) {
        pauVar10 = local_d8[0];
        if (yVar2 == '\r') {
          if (pyVar3[1] == '\n') {
            local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
            goto LAB_0010d551;
          }
LAB_0010d58c:
          local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
LAB_0010d595:
          (*pauVar10)[0] = 10;
          ppyVar24 = &(parser->buffer).pointer;
          *ppyVar24 = *ppyVar24 + 1;
LAB_0010d648:
          (parser->mark).column = 0;
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).line = (parser->mark).line + 1;
          sVar13 = parser->unread - 1;
          goto LAB_0010d672;
        }
        if (yVar2 == 0xc2) {
          if (pyVar3[1] == 0x85) {
            local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
            goto LAB_0010d5bc;
          }
        }
        else if (yVar2 == '\n') goto LAB_0010d58c;
      }
LAB_0010d67b:
      sVar13 = parser->unread;
    }
    bVar25 = true;
  } while( true );
  if (bVar25) {
    if (*(yaml_char_t *)local_e8 == '\n') {
      if (*(yaml_char_t *)local_108 == '\0') {
        if ((pauStack_120 <= (undefined1 (*) [16])(*apauStack_118[0] + 5)) &&
           (iVar8 = yaml_string_extend((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                       (yaml_char_t **)&pauStack_120), iVar8 == 0))
        goto LAB_0010d800;
        (*apauStack_118[0])[0] = 0x20;
        apauStack_118[0] = (undefined1 (*) [16])(*apauStack_118[0] + 1);
      }
      else {
        iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                                 (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_108,local_f8,
                                 (yaml_char_t **)(local_108 + 8));
        if (iVar8 == 0) goto LAB_0010d800;
        local_f8[0] = (yaml_char_t *)local_108;
        memset((void *)local_108,0,(long)pauStack_100 - (long)local_108);
      }
      local_d8[0] = (undefined1 (*) [16])local_e8;
      ppyVar24 = (yaml_char_t **)(local_e8 + 8);
      __s = local_e8;
    }
    else {
      iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                               (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_e8,
                               (yaml_char_t **)local_d8,(yaml_char_t **)(local_e8 + 8));
      if (iVar8 == 0) goto LAB_0010d800;
      local_d8[0] = (undefined1 (*) [16])local_e8;
      ppyVar24 = (yaml_char_t **)(local_108 + 8);
      iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                               (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_108,local_f8,
                               ppyVar24);
      if (iVar8 == 0) goto LAB_0010d800;
      local_d8[0] = (undefined1 (*) [16])local_e8;
      memset((void *)local_e8,0,(long)pauStack_e0 - (long)local_e8);
      local_f8[0] = (yaml_char_t *)local_108;
      __s = local_108;
    }
  }
  else {
    ppyVar24 = (yaml_char_t **)(local_c8 + 8);
    iVar8 = yaml_string_join((yaml_char_t **)&local_128,(yaml_char_t **)apauStack_118,
                             (yaml_char_t **)&pauStack_120,(yaml_char_t **)local_c8,
                             (yaml_char_t **)&local_b8,ppyVar24);
    if (iVar8 == 0) goto LAB_0010d800;
    local_b8 = (undefined1 (*) [16])local_c8;
    __s = local_c8;
  }
  memset((void *)__s,0,(long)*ppyVar24 - (long)__s);
  uVar11 = parser->unread;
  goto LAB_0010c67e;
}

Assistant:

static int
yaml_parser_fetch_flow_scalar(yaml_parser_t *parser, int single)
{
    yaml_token_t token;

    /* A plain scalar could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a flow scalar. */

    parser->simple_key_allowed = 0;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_flow_scalar(parser, &token, single))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}